

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_close_sockets.c
# Opt level: O0

void ares_close_connection(ares_conn_t *conn,ares_status_t requeue_status)

{
  ares_server_t *paVar1;
  ares_channel_t *channel_00;
  ares_llist_node_t *node;
  ares_channel_t *channel;
  ares_server_t *server;
  ares_status_t requeue_status_local;
  ares_conn_t *conn_local;
  
  paVar1 = conn->server;
  channel_00 = paVar1->channel;
  node = (ares_llist_node_t *)ares_htable_asvp_get_direct(channel_00->connnode_by_socket,conn->fd);
  ares_llist_node_claim(node);
  ares_htable_asvp_remove(channel_00->connnode_by_socket,conn->fd);
  if ((conn->flags & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE) {
    paVar1->tcp_conn = (ares_conn_t *)0x0;
  }
  ares_buf_destroy(conn->in_buf);
  ares_buf_destroy(conn->out_buf);
  ares_requeue_queries(conn,requeue_status);
  ares_llist_destroy(conn->queries_to_conn);
  ares_conn_sock_state_cb_update(conn,ARES_CONN_STATE_NONE);
  ares_socket_close(channel_00,conn->fd);
  ares_free(conn);
  return;
}

Assistant:

void ares_close_connection(ares_conn_t *conn, ares_status_t requeue_status)
{
  ares_server_t  *server  = conn->server;
  ares_channel_t *channel = server->channel;

  /* Unlink */
  ares_llist_node_claim(
    ares_htable_asvp_get_direct(channel->connnode_by_socket, conn->fd));
  ares_htable_asvp_remove(channel->connnode_by_socket, conn->fd);

  if (conn->flags & ARES_CONN_FLAG_TCP) {
    server->tcp_conn = NULL;
  }

  ares_buf_destroy(conn->in_buf);
  ares_buf_destroy(conn->out_buf);

  /* Requeue queries to other connections */
  ares_requeue_queries(conn, requeue_status);

  ares_llist_destroy(conn->queries_to_conn);

  ares_conn_sock_state_cb_update(conn, ARES_CONN_STATE_NONE);

  ares_socket_close(channel, conn->fd);

  ares_free(conn);
}